

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

bool __thiscall argvParser::foundAllRequierdArgs(argvParser *this)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar1;
  reference ppsVar2;
  reference ppaVar3;
  int x;
  ulong __n;
  ulong uVar4;
  int y;
  ulong __n_00;
  
  for (__n = 0; pvVar1 = (this->super_argParserAdvancedConfiguration).newargconfig,
      uVar4 = (long)(pvVar1->
                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar1->
                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3, __n < uVar4; __n = __n + 1) {
    __n_00 = 0;
    while (ppsVar2 = std::
                     vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     ::at((this->super_argParserAdvancedConfiguration).newargconfig,__n),
          __n_00 < (ulong)((long)((*ppsVar2)->arguments->
                                 super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)((*ppsVar2)->arguments->
                                 super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3)) {
      ppsVar2 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at((this->super_argParserAdvancedConfiguration).newargconfig,__n);
      ppaVar3 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar2)->arguments,__n_00);
      __n_00 = __n_00 + 1;
      if ((*ppaVar3)->requiredAndNotHitJet != false) goto LAB_001062ac;
    }
  }
LAB_001062ac:
  return uVar4 <= __n;
}

Assistant:

bool argvParser::foundAllRequierdArgs() {
    for (int x = 0; x < newargconfig->size(); x++) {
        for(int y = 0; y<newargconfig->at(x)->arguments->size();y++){
            if (newargconfig->at(x)->arguments->at(y)->requiredAndNotHitJet)
                return false;
        }

    }
    return true;
}